

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::insert_heap
          (clusterizer<crnlib::vec<16U,_float>_> *this,uint node_index)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vq_node *pvVar5;
  uint *puVar6;
  uint in_ESI;
  long in_RDI;
  float parent_variance;
  uint parent;
  uint pos;
  float variance;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_14;
  
  pvVar5 = vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     ((vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *)
                      (in_RDI + 0x10),in_ESI);
  fVar1 = pvVar5->m_variance;
  local_14 = *(int *)(in_RDI + 0x48) + 1;
  *(uint *)(in_RDI + 0x48) = local_14;
  uVar4 = *(uint *)(in_RDI + 0x48);
  uVar3 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x38));
  if (uVar3 <= uVar4) {
    vector<unsigned_int>::resize
              ((vector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffe4,uVar4),
               (uint)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  }
  while (uVar4 = local_14 >> 1, uVar4 != 0) {
    puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x38),uVar4);
    pvVar5 = vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                       ((vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *)
                        (in_RDI + 0x10),*puVar6);
    if (fVar1 < pvVar5->m_variance) break;
    puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x38),uVar4);
    uVar2 = *puVar6;
    puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x38),local_14);
    *puVar6 = uVar2;
    local_14 = uVar4;
  }
  puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x38),local_14);
  *puVar6 = in_ESI;
  return;
}

Assistant:

void insert_heap(uint node_index) {
    const float variance = m_nodes[node_index].m_variance;
    uint pos = ++m_heap_size;

    if (m_heap_size >= m_heap.size())
      m_heap.resize(m_heap_size + 1);

    for (;;) {
      uint parent = pos >> 1;
      if (!parent)
        break;

      float parent_variance = m_nodes[m_heap[parent]].m_variance;
      if (parent_variance > variance)
        break;

      m_heap[pos] = m_heap[parent];

      pos = parent;
    }

    m_heap[pos] = node_index;
  }